

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

_Bool uxpgnt_ask_passphrase(PageantListenerClient *plc,PageantClientDialogId *dlgid,char *comment)

{
  undefined1 extraout_AL;
  int iVar1;
  __pid_t _Var2;
  char *ptr;
  int iVar3;
  int pipefds [2];
  int local_50;
  int local_4c;
  
  if (plc[-1].vt != (PageantListenerClientVtable *)0x0) {
    __assert_fail("!upc->dlgid",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                  ,0x6f,
                  "_Bool uxpgnt_ask_passphrase(PageantListenerClient *, PageantClientDialogId *, const char *)"
                 );
  }
  ptr = dupprintf("A client of Pageant wants to use the following encrypted key:\n%s\nIf you intended this, enter the passphrase to decrypt the key."
                  ,comment);
  iVar3 = *(int *)&plc[-2].suppress_logging;
  if (iVar3 == 2) {
    setup_sigchld_handler();
    iVar1 = pipe(&local_50);
    iVar3 = -1;
    if (-1 < iVar1) {
      _Var2 = fork();
      if (_Var2 < 0) {
        close(local_50);
        close(local_4c);
      }
      else {
        if (_Var2 == 0) {
          uxpgnt_ask_passphrase_cold_1();
          return (_Bool)extraout_AL;
        }
        close(local_4c);
        iVar3 = local_50;
      }
    }
    *(int *)&plc[-1].suppress_logging = iVar3;
    safefree(ptr);
    if (*(int *)&plc[-1].suppress_logging < 0) {
      return false;
    }
  }
  else if (iVar3 == 1) {
    fprintf(*(FILE **)&plc[-3].suppress_logging,"pageant passphrase request: %s\n",ptr);
    safefree(ptr);
  }
  else if (iVar3 == 0) {
    safefree(ptr);
    return false;
  }
  plc[-2].field_0xc = 1;
  plc[-1].vt = (PageantListenerClientVtable *)dlgid;
  return true;
}

Assistant:

static bool uxpgnt_ask_passphrase(
    PageantListenerClient *plc, PageantClientDialogId *dlgid,
    const char *comment)
{
    struct uxpgnt_client *upc = container_of(plc, struct uxpgnt_client, plc);

    assert(!upc->dlgid); /* Pageant core should be serialising requests */

    char *msg = dupprintf(
        "A client of Pageant wants to use the following encrypted key:\n"
        "%s\n"
        "If you intended this, enter the passphrase to decrypt the key.",
        comment);

    switch (upc->prompt_type) {
      case RTPROMPT_UNAVAILABLE:
        sfree(msg);
        return false;

      case RTPROMPT_GUI:
        upc->passphrase_fd = make_pipe_to_askpass(msg);
        sfree(msg);
        if (upc->passphrase_fd < 0)
            return false; /* something went wrong */
        break;

      case RTPROMPT_DEBUG:
        fprintf(upc->logfp, "pageant passphrase request: %s\n", msg);
        sfree(msg);
        break;
    }

    upc->prompt_active = true;
    upc->dlgid = dlgid;
    return true;
}